

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O0

char * Rwt_ManGetPractical(Rwt_Man_t *p)

{
  char *__s;
  int local_1c;
  int i;
  char *pPractical;
  Rwt_Man_t *p_local;
  
  __s = (char *)malloc((long)p->nFuncs);
  memset(__s,0,(long)p->nFuncs);
  *__s = '\x01';
  for (local_1c = 1; s_RwtPracticalClasses[local_1c] != 0; local_1c = local_1c + 1) {
    __s[s_RwtPracticalClasses[local_1c]] = '\x01';
  }
  return __s;
}

Assistant:

char * Rwt_ManGetPractical( Rwt_Man_t * p )
{
    char * pPractical;
    int i;
    pPractical = ABC_ALLOC( char, p->nFuncs );
    memset( pPractical, 0, sizeof(char) * p->nFuncs );
    pPractical[0] = 1;
    for ( i = 1; ; i++ )
    {
        if ( s_RwtPracticalClasses[i] == 0 )
            break;
        pPractical[ s_RwtPracticalClasses[i] ] = 1;
    }
    return pPractical;
}